

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::remaxRow(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int p_row,int len)

{
  Dring *pDVar1;
  int iVar2;
  Dring *pDVar3;
  Dring *pDVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  fpclass_type *pfVar17;
  int *piVar18;
  long lVar19;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> vv;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  if ((U *)(this->u).row.elem[p_row].next == &this->u) {
    iVar13 = len - (this->u).row.max[p_row];
    if ((this->u).row.size - (this->u).row.used < iVar13) {
      packRows(this);
      iVar13 = len - (this->u).row.max[p_row];
      local_128.fpclass = cpp_dec_float_finite;
      local_128.prec_elem = 0x10;
      local_128.data._M_elems[0] = 0;
      local_128.data._M_elems[1] = 0;
      local_128.data._M_elems[2] = 0;
      local_128.data._M_elems[3] = 0;
      local_128.data._M_elems[4] = 0;
      local_128.data._M_elems[5] = 0;
      local_128.data._M_elems[6] = 0;
      local_128.data._M_elems[7] = 0;
      local_128.data._M_elems[8] = 0;
      local_128.data._M_elems[9] = 0;
      local_128.data._M_elems[10] = 0;
      local_128.data._M_elems[0xb] = 0;
      local_128.data._M_elems[0xc] = 0;
      local_128.data._M_elems[0xd] = 0;
      local_128.data._M_elems._56_5_ = 0;
      local_128.data._M_elems[0xf]._1_3_ = 0;
      local_128.exp = 0;
      local_128.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_d8,(long)(this->u).row.used,(type *)0x0);
      if (&local_128 != &(this->rowMemMult).m_backend) {
        local_128.data._M_elems._0_8_ = *(undefined8 *)(this->rowMemMult).m_backend.data._M_elems;
        local_128.data._M_elems._8_8_ =
             *(undefined8 *)((this->rowMemMult).m_backend.data._M_elems + 2);
        local_128.data._M_elems._16_8_ =
             *(undefined8 *)((this->rowMemMult).m_backend.data._M_elems + 4);
        local_128.data._M_elems._24_8_ =
             *(undefined8 *)((this->rowMemMult).m_backend.data._M_elems + 6);
        local_128.data._M_elems._32_8_ =
             *(undefined8 *)((this->rowMemMult).m_backend.data._M_elems + 8);
        local_128.data._M_elems._40_8_ =
             *(undefined8 *)((this->rowMemMult).m_backend.data._M_elems + 10);
        local_128.data._M_elems._48_8_ =
             *(undefined8 *)((this->rowMemMult).m_backend.data._M_elems + 0xc);
        uVar6 = *(undefined8 *)((this->rowMemMult).m_backend.data._M_elems + 0xe);
        local_128.data._M_elems._56_5_ = SUB85(uVar6,0);
        local_128.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_128.exp = (this->rowMemMult).m_backend.exp;
        local_128.neg = (this->rowMemMult).m_backend.neg;
        local_128.fpclass = (this->rowMemMult).m_backend.fpclass;
        local_128.prec_elem = (this->rowMemMult).m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_128,&local_d8);
      local_88.fpclass = cpp_dec_float_finite;
      local_88.prec_elem = 0x10;
      local_88.data._M_elems[0] = 0;
      local_88.data._M_elems[1] = 0;
      local_88.data._M_elems[2] = 0;
      local_88.data._M_elems[3] = 0;
      local_88.data._M_elems[4] = 0;
      local_88.data._M_elems[5] = 0;
      local_88.data._M_elems[6] = 0;
      local_88.data._M_elems[7] = 0;
      local_88.data._M_elems[8] = 0;
      local_88.data._M_elems[9] = 0;
      local_88.data._M_elems[10] = 0;
      local_88.data._M_elems[0xb] = 0;
      local_88.data._M_elems[0xc] = 0;
      local_88.data._M_elems[0xd] = 0;
      local_88.data._M_elems._56_5_ = 0;
      local_88.data._M_elems[0xf]._1_3_ = 0;
      local_88.exp = 0;
      local_88.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_d8,(long)len,(type *)0x0);
      local_88.data._M_elems[0xc] = local_128.data._M_elems[0xc];
      local_88.data._M_elems[0xd] = local_128.data._M_elems[0xd];
      local_88.data._M_elems._56_5_ = local_128.data._M_elems._56_5_;
      local_88.data._M_elems[0xf]._1_3_ = local_128.data._M_elems[0xf]._1_3_;
      local_88.data._M_elems[8] = local_128.data._M_elems[8];
      local_88.data._M_elems[9] = local_128.data._M_elems[9];
      local_88.data._M_elems[10] = local_128.data._M_elems[10];
      local_88.data._M_elems[0xb] = local_128.data._M_elems[0xb];
      local_88.data._M_elems[4] = local_128.data._M_elems[4];
      local_88.data._M_elems[5] = local_128.data._M_elems[5];
      local_88.data._M_elems[6] = local_128.data._M_elems[6];
      local_88.data._M_elems[7] = local_128.data._M_elems[7];
      local_88.data._M_elems[0] = local_128.data._M_elems[0];
      local_88.data._M_elems[1] = local_128.data._M_elems[1];
      local_88.data._M_elems[2] = local_128.data._M_elems[2];
      local_88.data._M_elems[3] = local_128.data._M_elems[3];
      local_88.exp = local_128.exp;
      local_88.neg = local_128.neg;
      local_88.fpclass = local_128.fpclass;
      local_88.prec_elem = local_128.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (&local_88,&local_d8);
      if (local_88.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (&local_d8,(long)(this->u).row.size,(type *)0x0);
        iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_88,&local_d8);
        if (0 < iVar14) {
          minRowMem(this,len + (this->u).row.used * 2);
        }
      }
    }
    piVar18 = &(this->u).row.used;
    *piVar18 = *piVar18 + iVar13;
    (this->u).row.max[p_row] = len;
  }
  else {
    if ((this->u).row.size - (this->u).row.used < len) {
      packRows(this);
      local_128.fpclass = cpp_dec_float_finite;
      local_128.prec_elem = 0x10;
      local_128.data._M_elems[0] = 0;
      local_128.data._M_elems[1] = 0;
      local_128.data._M_elems[2] = 0;
      local_128.data._M_elems[3] = 0;
      local_128.data._M_elems[4] = 0;
      local_128.data._M_elems[5] = 0;
      local_128.data._M_elems[6] = 0;
      local_128.data._M_elems[7] = 0;
      local_128.data._M_elems[8] = 0;
      local_128.data._M_elems[9] = 0;
      local_128.data._M_elems[10] = 0;
      local_128.data._M_elems[0xb] = 0;
      local_128.data._M_elems[0xc] = 0;
      local_128.data._M_elems[0xd] = 0;
      local_128.data._M_elems._56_5_ = 0;
      local_128.data._M_elems[0xf]._1_3_ = 0;
      local_128.exp = 0;
      local_128.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_d8,(long)(this->u).row.used,(type *)0x0);
      if (&local_128 != &(this->rowMemMult).m_backend) {
        local_128.data._M_elems._0_8_ = *(undefined8 *)(this->rowMemMult).m_backend.data._M_elems;
        local_128.data._M_elems._8_8_ =
             *(undefined8 *)((this->rowMemMult).m_backend.data._M_elems + 2);
        local_128.data._M_elems._16_8_ =
             *(undefined8 *)((this->rowMemMult).m_backend.data._M_elems + 4);
        local_128.data._M_elems._24_8_ =
             *(undefined8 *)((this->rowMemMult).m_backend.data._M_elems + 6);
        local_128.data._M_elems._32_8_ =
             *(undefined8 *)((this->rowMemMult).m_backend.data._M_elems + 8);
        local_128.data._M_elems._40_8_ =
             *(undefined8 *)((this->rowMemMult).m_backend.data._M_elems + 10);
        local_128.data._M_elems._48_8_ =
             *(undefined8 *)((this->rowMemMult).m_backend.data._M_elems + 0xc);
        uVar6 = *(undefined8 *)((this->rowMemMult).m_backend.data._M_elems + 0xe);
        local_128.data._M_elems._56_5_ = SUB85(uVar6,0);
        local_128.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_128.exp = (this->rowMemMult).m_backend.exp;
        local_128.neg = (this->rowMemMult).m_backend.neg;
        local_128.fpclass = (this->rowMemMult).m_backend.fpclass;
        local_128.prec_elem = (this->rowMemMult).m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_128,&local_d8);
      local_88.fpclass = cpp_dec_float_finite;
      local_88.prec_elem = 0x10;
      local_88.data._M_elems[0] = 0;
      local_88.data._M_elems[1] = 0;
      local_88.data._M_elems[2] = 0;
      local_88.data._M_elems[3] = 0;
      local_88.data._M_elems[4] = 0;
      local_88.data._M_elems[5] = 0;
      local_88.data._M_elems[6] = 0;
      local_88.data._M_elems[7] = 0;
      local_88.data._M_elems[8] = 0;
      local_88.data._M_elems[9] = 0;
      local_88.data._M_elems[10] = 0;
      local_88.data._M_elems[0xb] = 0;
      local_88.data._M_elems[0xc] = 0;
      local_88.data._M_elems[0xd] = 0;
      local_88.data._M_elems._56_5_ = 0;
      local_88.data._M_elems[0xf]._1_3_ = 0;
      local_88.exp = 0;
      local_88.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_d8,(long)len,(type *)0x0);
      local_88.data._M_elems[0xc] = local_128.data._M_elems[0xc];
      local_88.data._M_elems[0xd] = local_128.data._M_elems[0xd];
      local_88.data._M_elems._56_5_ = local_128.data._M_elems._56_5_;
      local_88.data._M_elems[0xf]._1_3_ = local_128.data._M_elems[0xf]._1_3_;
      local_88.data._M_elems[8] = local_128.data._M_elems[8];
      local_88.data._M_elems[9] = local_128.data._M_elems[9];
      local_88.data._M_elems[10] = local_128.data._M_elems[10];
      local_88.data._M_elems[0xb] = local_128.data._M_elems[0xb];
      local_88.data._M_elems[4] = local_128.data._M_elems[4];
      local_88.data._M_elems[5] = local_128.data._M_elems[5];
      local_88.data._M_elems[6] = local_128.data._M_elems[6];
      local_88.data._M_elems[7] = local_128.data._M_elems[7];
      local_88.data._M_elems[0] = local_128.data._M_elems[0];
      local_88.data._M_elems[1] = local_128.data._M_elems[1];
      local_88.data._M_elems[2] = local_128.data._M_elems[2];
      local_88.data._M_elems[3] = local_128.data._M_elems[3];
      local_88.exp = local_128.exp;
      local_88.neg = local_128.neg;
      local_88.fpclass = local_128.fpclass;
      local_88.prec_elem = local_128.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (&local_88,&local_d8);
      if (local_88.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (&local_d8,(long)(this->u).row.size,(type *)0x0);
        iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_88,&local_d8);
        if (0 < iVar13) {
          minRowMem(this,len + (this->u).row.used * 2);
        }
      }
    }
    iVar13 = (this->u).row.used;
    lVar19 = (long)iVar13;
    piVar18 = (this->u).row.start;
    iVar14 = piVar18[p_row];
    lVar15 = (long)iVar14;
    iVar2 = (this->u).row.len[p_row];
    piVar18[p_row] = iVar13;
    piVar18 = &(this->u).row.used;
    *piVar18 = *piVar18 + len;
    piVar18 = (this->u).row.max;
    pDVar1 = (this->u).row.elem + p_row;
    piVar18[pDVar1->prev->idx] = piVar18[pDVar1->prev->idx] + piVar18[p_row];
    piVar18[p_row] = len;
    pDVar3 = pDVar1->next;
    pDVar3->prev = pDVar1->prev;
    pDVar1->prev->next = pDVar3;
    pDVar3 = (this->u).row.list.prev;
    pDVar4 = pDVar3->next;
    pDVar1->next = pDVar4;
    pDVar4->prev = pDVar1;
    pDVar1->prev = pDVar3;
    pDVar3->next = pDVar1;
    if (0 < iVar2) {
      piVar5 = (this->u).row.idx;
      piVar18 = piVar5 + lVar19;
      pfVar17 = &(((this->u).row.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).fpclass;
      lVar16 = lVar15;
      do {
        uVar6 = *(undefined8 *)(pfVar17 + lVar15 * 0x14 + -0x12);
        uVar7 = *(undefined8 *)(pfVar17 + lVar15 * 0x14 + -0x12 + 2);
        uVar8 = *(undefined8 *)(pfVar17 + lVar15 * 0x14 + -0xe);
        uVar9 = *(undefined8 *)(pfVar17 + lVar15 * 0x14 + -0xe + 2);
        uVar10 = *(undefined8 *)(pfVar17 + lVar15 * 0x14 + -10);
        uVar11 = *(undefined8 *)(pfVar17 + lVar15 * 0x14 + -10 + 2);
        uVar12 = *(undefined8 *)(pfVar17 + lVar15 * 0x14 + -6 + 2);
        *(undefined8 *)(pfVar17 + lVar19 * 0x14 + -6) =
             *(undefined8 *)(pfVar17 + lVar15 * 0x14 + -6);
        *(undefined8 *)(pfVar17 + lVar19 * 0x14 + -6 + 2) = uVar12;
        *(undefined8 *)(pfVar17 + lVar19 * 0x14 + -10) = uVar10;
        *(undefined8 *)(pfVar17 + lVar19 * 0x14 + -10 + 2) = uVar11;
        *(undefined8 *)(pfVar17 + lVar19 * 0x14 + -0xe) = uVar8;
        *(undefined8 *)(pfVar17 + lVar19 * 0x14 + -0xe + 2) = uVar9;
        *(undefined8 *)(pfVar17 + lVar19 * 0x14 + -0x12) = uVar6;
        *(undefined8 *)(pfVar17 + lVar19 * 0x14 + -0x12 + 2) = uVar7;
        pfVar17[lVar19 * 0x14 + -2] = pfVar17[lVar15 * 0x14 + -2];
        *(char *)(pfVar17 + lVar19 * 0x14 + -1) = (char)pfVar17[lVar15 * 0x14 + -1];
        *(undefined8 *)(pfVar17 + lVar19 * 0x14) = *(undefined8 *)(pfVar17 + lVar15 * 0x14);
        *piVar18 = piVar5[lVar16];
        lVar16 = lVar16 + 1;
        pfVar17 = pfVar17 + 0x14;
        piVar18 = piVar18 + 1;
      } while (lVar16 < iVar2 + iVar14);
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::remaxRow(int p_row, int len)
{
   assert(u.row.max[p_row] < len);

   if(u.row.elem[p_row].next == &(u.row.list))      /* last in row file */
   {
      int delta = len - u.row.max[p_row];

      if(delta > u.row.size - u.row.used)
      {
         packRows();
         delta = len - u.row.max[p_row];  // packRows() changes u.row.max[] !

         if(u.row.size < rowMemMult * u.row.used + len)
            minRowMem(2 * u.row.used + len);

         /* minRowMem(rowMemMult * u.row.used + len); */
      }

      assert(delta <= u.row.size - u.row.used

             && "ERROR: could not allocate memory for row file");

      u.row.used += delta;
      u.row.max[p_row] = len;
   }
   else                        /* row must be moved to end of row file */
   {
      int i, j, k;
      int* idx;
      R* val;
      Dring* ring;

      if(len > u.row.size - u.row.used)
      {
         packRows();

         if(u.row.size < rowMemMult * u.row.used + len)
            minRowMem(2 * u.row.used + len);

         /* minRowMem(rowMemMult * u.row.used + len);*/
      }

      assert(len <= u.row.size - u.row.used

             && "ERROR: could not allocate memory for row file");

      j = u.row.used;
      i = u.row.start[p_row];
      k = u.row.len[p_row] + i;
      u.row.start[p_row] = j;
      u.row.used += len;

      u.row.max[u.row.elem[p_row].prev->idx] += u.row.max[p_row];
      u.row.max[p_row] = len;
      removeDR(u.row.elem[p_row]);
      ring = u.row.list.prev;
      init2DR(u.row.elem[p_row], *ring);

      idx = u.row.idx;
      val = u.row.val.data();

      for(; i < k; ++i, ++j)
      {
         val[j] = val[i];
         idx[j] = idx[i];
      }
   }

   assert(u.row.start[u.row.list.prev->idx] + u.row.max[u.row.list.prev->idx]

          == u.row.used);
}